

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O3

int ncnn::reduction_op<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  float fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  Allocator *pAVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  void *pvVar11;
  long lVar12;
  void *pvVar13;
  uint uVar14;
  int *piVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  bool bVar20;
  void *pvVar21;
  ulong uVar22;
  ulong uVar23;
  float fVar24;
  void *ptr;
  Mat local_78;
  
  sVar3 = a->elemsize;
  iVar2 = a->dims;
  if (iVar2 == 3) {
    uVar10 = a->w;
    uVar19 = (ulong)uVar10;
    uVar8 = a->h;
    uVar17 = (ulong)uVar8;
    iVar2 = a->c;
    lVar12 = (long)iVar2;
    uVar14 = uVar8 * uVar10;
    bVar20 = !reduce_w;
    bVar7 = !reduce_h;
    if ((bVar20 || bVar7) || !reduce_c) {
      if ((!bVar20 && !bVar7) && !reduce_c) {
        Mat::create(b,iVar2,sVar3,opt->blob_allocator);
        if (0 < iVar2) {
          sVar3 = a->cstep;
          sVar4 = a->elemsize;
          pvVar11 = a->data;
          pvVar13 = b->data;
          lVar16 = 0;
          do {
            fVar24 = 0.0;
            if (0 < (int)uVar14) {
              uVar19 = 0;
              do {
                fVar1 = *(float *)((long)pvVar11 + uVar19 * 4);
                fVar24 = fVar24 + fVar1 * fVar1;
                uVar19 = uVar19 + 1;
              } while (uVar14 != uVar19);
            }
            *(float *)((long)pvVar13 + lVar16 * 4) = fVar24;
            lVar16 = lVar16 + 1;
            pvVar11 = (void *)((long)pvVar11 + sVar3 * sVar4);
          } while (lVar16 != lVar12);
          return 0;
        }
        return 0;
      }
      lVar16 = (long)(int)uVar10;
      if ((!bVar20 && !reduce_h) && !reduce_c) {
        Mat::create(b,uVar8,iVar2,sVar3,opt->blob_allocator);
        if (0 < iVar2) {
          pvVar11 = a->data;
          sVar3 = a->cstep;
          iVar2 = b->w;
          sVar4 = b->elemsize;
          sVar5 = a->elemsize;
          pvVar13 = b->data;
          lVar18 = 0;
          do {
            if (0 < (int)uVar8) {
              uVar22 = 0;
              pvVar21 = pvVar11;
              do {
                fVar24 = 0.0;
                if (0 < (int)uVar10) {
                  uVar23 = 0;
                  do {
                    fVar1 = *(float *)((long)pvVar21 + uVar23 * 4);
                    fVar24 = fVar24 + fVar1 * fVar1;
                    uVar23 = uVar23 + 1;
                  } while (uVar19 != uVar23);
                }
                *(float *)((long)pvVar13 + uVar22 * 4 + lVar18 * (long)iVar2 * sVar4) = fVar24;
                uVar22 = uVar22 + 1;
                pvVar21 = (void *)((long)pvVar21 + lVar16 * 4);
              } while (uVar22 != uVar17);
            }
            lVar18 = lVar18 + 1;
            pvVar11 = (void *)((long)pvVar11 + sVar3 * sVar5);
          } while (lVar18 != lVar12);
          return 0;
        }
        return 0;
      }
      if ((!bVar20 && !reduce_h) && reduce_c) {
        Mat::create(b,uVar8,sVar3,opt->blob_allocator);
        local_78.elemsize._0_4_ = 0;
        local_78.elemsize._4_4_ = 0;
        local_78.elempack = 0;
        local_78.data = (void *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.c = 0;
        local_78.cstep = 0;
        Mat::create(&local_78,1,uVar8,iVar2,sVar3,opt->workspace_allocator);
        pvVar11 = local_78.data;
        iVar9 = -100;
        if ((local_78.data == (void *)0x0) || (local_78.cstep * (long)local_78.c == 0))
        goto LAB_0015afd3;
        uVar14 = (int)local_78.cstep * local_78.c;
        if (0 < (int)uVar14) {
          memset(local_78.data,0,(ulong)uVar14 << 2);
        }
        if (0 < iVar2) {
          sVar3 = a->cstep;
          sVar4 = a->elemsize;
          pvVar13 = a->data;
          lVar18 = 0;
          do {
            if (0 < (int)uVar8) {
              uVar22 = 0;
              pvVar21 = pvVar13;
              do {
                fVar24 = 0.0;
                if (0 < (int)uVar10) {
                  uVar23 = 0;
                  do {
                    fVar1 = *(float *)((long)pvVar21 + uVar23 * 4);
                    fVar24 = fVar24 + fVar1 * fVar1;
                    uVar23 = uVar23 + 1;
                  } while (uVar19 != uVar23);
                }
                *(float *)((long)pvVar11 +
                          uVar22 * 4 +
                          local_78.cstep *
                          CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) * lVar18)
                     = fVar24;
                uVar22 = uVar22 + 1;
                pvVar21 = (void *)((long)pvVar21 + lVar16 * 4);
              } while (uVar22 != uVar17);
            }
            lVar18 = lVar18 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar3 * sVar4);
          } while (lVar18 != lVar12);
        }
        uVar10 = b->c * (int)b->cstep;
        if (0 < (int)uVar10) {
          memset(b->data,0,(ulong)uVar10 << 2);
        }
        if (0 < iVar2) {
          pvVar11 = b->data;
          lVar16 = 0;
          pvVar13 = local_78.data;
          do {
            if (0 < (int)uVar8) {
              uVar19 = 0;
              do {
                *(float *)((long)pvVar11 + uVar19 * 4) =
                     *(float *)((long)pvVar13 + uVar19 * 4) + *(float *)((long)pvVar11 + uVar19 * 4)
                ;
                uVar19 = uVar19 + 1;
              } while (uVar17 != uVar19);
            }
            lVar16 = lVar16 + 1;
            pvVar13 = (void *)((long)pvVar13 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
          } while (lVar16 != lVar12);
        }
      }
      else {
        if ((bVar7 || reduce_w) || !reduce_c) {
          if ((!reduce_w && !reduce_h) && reduce_c) {
            Mat::create(b,uVar10,uVar8,sVar3,opt->blob_allocator);
            uVar10 = b->c * (int)b->cstep;
            if (0 < (int)uVar10) {
              memset(b->data,0,(ulong)uVar10 << 2);
            }
            if (0 < iVar2) {
              sVar3 = a->cstep;
              sVar4 = a->elemsize;
              pvVar11 = a->data;
              pvVar13 = b->data;
              lVar16 = 0;
              do {
                if (0 < (int)uVar14) {
                  uVar19 = 0;
                  do {
                    fVar24 = *(float *)((long)pvVar11 + uVar19 * 4);
                    *(float *)((long)pvVar13 + uVar19 * 4) =
                         fVar24 * fVar24 + *(float *)((long)pvVar13 + uVar19 * 4);
                    uVar19 = uVar19 + 1;
                  } while (uVar14 != uVar19);
                }
                lVar16 = lVar16 + 1;
                pvVar11 = (void *)((long)pvVar11 + sVar3 * sVar4);
              } while (lVar16 != lVar12);
              return 0;
            }
            return 0;
          }
          if ((bVar7 || reduce_w) || reduce_c) {
            return 0;
          }
          Mat::create(b,uVar10,iVar2,sVar3,opt->blob_allocator);
          uVar14 = b->c * (int)b->cstep;
          if (0 < (int)uVar14) {
            memset(b->data,0,(ulong)uVar14 << 2);
          }
          if (0 < iVar2) {
            pvVar11 = a->data;
            sVar3 = a->cstep;
            pvVar13 = b->data;
            iVar2 = b->w;
            sVar4 = b->elemsize;
            sVar5 = a->elemsize;
            lVar18 = 0;
            do {
              if (0 < (int)uVar8) {
                uVar14 = 0;
                pvVar21 = pvVar11;
                do {
                  if (0 < (int)uVar10) {
                    uVar17 = 0;
                    do {
                      fVar24 = *(float *)((long)pvVar21 + uVar17 * 4);
                      *(float *)((long)pvVar13 + uVar17 * 4) =
                           fVar24 * fVar24 + *(float *)((long)pvVar13 + uVar17 * 4);
                      uVar17 = uVar17 + 1;
                    } while (uVar19 != uVar17);
                  }
                  uVar14 = uVar14 + 1;
                  pvVar21 = (void *)((long)pvVar21 + lVar16 * 4);
                } while (uVar14 != uVar8);
              }
              lVar18 = lVar18 + 1;
              pvVar11 = (void *)((long)pvVar11 + sVar3 * sVar5);
              pvVar13 = (void *)((long)pvVar13 + (long)iVar2 * sVar4);
            } while (lVar18 != lVar12);
            return 0;
          }
          return 0;
        }
        Mat::create(b,uVar10,sVar3,opt->blob_allocator);
        local_78.elemsize._0_4_ = 0;
        local_78.elemsize._4_4_ = 0;
        local_78.elempack = 0;
        local_78.data = (void *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.c = 0;
        local_78.cstep = 0;
        Mat::create(&local_78,uVar10,1,iVar2,sVar3,opt->workspace_allocator);
        pvVar11 = local_78.data;
        iVar9 = -100;
        if ((local_78.data == (void *)0x0) || (local_78.cstep * (long)local_78.c == 0))
        goto LAB_0015afd3;
        uVar14 = (int)local_78.cstep * local_78.c;
        if (0 < (int)uVar14) {
          memset(local_78.data,0,(ulong)uVar14 << 2);
        }
        if (0 < iVar2) {
          pvVar13 = a->data;
          sVar3 = a->cstep;
          sVar4 = a->elemsize;
          lVar18 = 0;
          do {
            if (0 < (int)uVar8) {
              uVar14 = 0;
              pvVar21 = pvVar13;
              do {
                if (0 < (int)uVar10) {
                  uVar17 = 0;
                  do {
                    fVar24 = *(float *)((long)pvVar21 + uVar17 * 4);
                    *(float *)((long)pvVar11 + uVar17 * 4) =
                         fVar24 * fVar24 + *(float *)((long)pvVar11 + uVar17 * 4);
                    uVar17 = uVar17 + 1;
                  } while (uVar19 != uVar17);
                }
                uVar14 = uVar14 + 1;
                pvVar21 = (void *)((long)pvVar21 + lVar16 * 4);
              } while (uVar14 != uVar8);
            }
            lVar18 = lVar18 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar3 * sVar4);
            pvVar11 = (void *)((long)pvVar11 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
          } while (lVar18 != lVar12);
        }
        uVar8 = b->c * (int)b->cstep;
        if (0 < (int)uVar8) {
          memset(b->data,0,(ulong)uVar8 << 2);
        }
        if (0 < iVar2) {
          pvVar11 = b->data;
          lVar16 = 0;
          pvVar13 = local_78.data;
          do {
            if (0 < (int)uVar10) {
              uVar17 = 0;
              do {
                *(float *)((long)pvVar11 + uVar17 * 4) =
                     *(float *)((long)pvVar13 + uVar17 * 4) + *(float *)((long)pvVar11 + uVar17 * 4)
                ;
                uVar17 = uVar17 + 1;
              } while (uVar19 != uVar17);
            }
            lVar16 = lVar16 + 1;
            pvVar13 = (void *)((long)pvVar13 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
          } while (lVar16 != lVar12);
        }
      }
      iVar9 = 0;
LAB_0015afd3:
      Mat::~Mat(&local_78);
      return iVar9;
    }
    Mat::create(b,1,sVar3,opt->blob_allocator);
    if (iVar2 == 0) {
      return -100;
    }
    pAVar6 = opt->workspace_allocator;
    uVar19 = sVar3 * lVar12 + 3 & 0xfffffffffffffffc;
    if (pAVar6 == (Allocator *)0x0) {
      local_78.data = (void *)0x0;
      iVar9 = posix_memalign(&local_78.data,0x10,uVar19 + 4);
      pvVar11 = (void *)0x0;
      if (iVar9 == 0) {
        pvVar11 = local_78.data;
      }
    }
    else {
      pvVar11 = (void *)(**(code **)(*(long *)pAVar6 + 0x10))();
    }
    *(undefined4 *)((long)pvVar11 + uVar19) = 1;
    if (iVar2 < 1) {
LAB_0015ac82:
      fVar24 = 0.0;
    }
    else {
      pvVar13 = a->data;
      sVar3 = a->cstep;
      sVar4 = a->elemsize;
      lVar16 = 0;
      do {
        fVar24 = 0.0;
        if (0 < (int)uVar14) {
          uVar17 = 0;
          do {
            fVar1 = *(float *)((long)pvVar13 + uVar17 * 4);
            fVar24 = fVar24 + fVar1 * fVar1;
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        *(float *)((long)pvVar11 + lVar16 * 4) = fVar24;
        lVar16 = lVar16 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar3 * sVar4);
      } while (lVar16 != lVar12);
      if (iVar2 < 1) goto LAB_0015ac82;
      fVar24 = 0.0;
      lVar16 = 0;
      do {
        fVar24 = fVar24 + *(float *)((long)pvVar11 + lVar16 * 4);
        lVar16 = lVar16 + 1;
      } while (lVar12 != lVar16);
    }
    *(float *)b->data = fVar24;
    LOCK();
    piVar15 = (int *)((long)pvVar11 + uVar19);
    *piVar15 = *piVar15 + -1;
    UNLOCK();
    if (*piVar15 != 0) {
      return 0;
    }
    if (pAVar6 != (Allocator *)0x0) {
      (**(code **)(*(long *)pAVar6 + 0x18))(pAVar6,pvVar11);
      return 0;
    }
    goto LAB_0015ae3d;
  }
  if (iVar2 != 2) {
    if (iVar2 == 1) {
      iVar2 = a->w;
      Mat::create(b,1,sVar3,opt->blob_allocator);
      if ((long)iVar2 < 1) {
        fVar24 = 0.0;
      }
      else {
        fVar24 = 0.0;
        lVar12 = 0;
        do {
          fVar1 = *(float *)((long)a->data + lVar12 * 4);
          fVar24 = fVar24 + fVar1 * fVar1;
          lVar12 = lVar12 + 1;
        } while (iVar2 != lVar12);
      }
      *(float *)b->data = fVar24;
      return 0;
    }
    return 0;
  }
  uVar10 = a->w;
  uVar19 = (ulong)uVar10;
  iVar2 = a->h;
  lVar12 = (long)iVar2;
  if (!reduce_w || !reduce_h) {
    if (reduce_w && !reduce_h) {
      Mat::create(b,iVar2,sVar3,opt->blob_allocator);
      if (0 < iVar2) {
        pvVar11 = a->data;
        iVar2 = a->w;
        pvVar13 = b->data;
        sVar3 = a->elemsize;
        lVar16 = 0;
        do {
          fVar24 = 0.0;
          if (0 < (int)uVar10) {
            uVar17 = 0;
            do {
              fVar1 = *(float *)((long)pvVar11 + uVar17 * 4);
              fVar24 = fVar24 + fVar1 * fVar1;
              uVar17 = uVar17 + 1;
            } while (uVar19 != uVar17);
          }
          *(float *)((long)pvVar13 + lVar16 * 4) = fVar24;
          lVar16 = lVar16 + 1;
          pvVar11 = (void *)((long)pvVar11 + (long)iVar2 * sVar3);
        } while (lVar16 != lVar12);
        return 0;
      }
      return 0;
    }
    if (!reduce_h || reduce_w) {
      return 0;
    }
    Mat::create(b,uVar10,sVar3,opt->blob_allocator);
    uVar8 = b->c * (int)b->cstep;
    if (0 < (int)uVar8) {
      memset(b->data,0,(ulong)uVar8 << 2);
    }
    if (0 < iVar2) {
      pvVar11 = a->data;
      iVar2 = a->w;
      pvVar13 = b->data;
      sVar3 = a->elemsize;
      lVar16 = 0;
      do {
        if (0 < (int)uVar10) {
          uVar17 = 0;
          do {
            fVar24 = *(float *)((long)pvVar11 + uVar17 * 4);
            *(float *)((long)pvVar13 + uVar17 * 4) =
                 fVar24 * fVar24 + *(float *)((long)pvVar13 + uVar17 * 4);
            uVar17 = uVar17 + 1;
          } while (uVar19 != uVar17);
        }
        lVar16 = lVar16 + 1;
        pvVar11 = (void *)((long)pvVar11 + (long)iVar2 * sVar3);
      } while (lVar16 != lVar12);
      return 0;
    }
    return 0;
  }
  Mat::create(b,1,sVar3,opt->blob_allocator);
  if (iVar2 == 0) {
    return -100;
  }
  pAVar6 = opt->workspace_allocator;
  piVar15 = (int *)(sVar3 * lVar12 + 3 & 0xfffffffffffffffc);
  if (pAVar6 == (Allocator *)0x0) {
    local_78.data = (void *)0x0;
    iVar9 = posix_memalign(&local_78.data,0x10,(size_t)(piVar15 + 1));
    pvVar11 = local_78.data;
    if (iVar9 != 0) {
      LOCK();
      *piVar15 = *piVar15 + -1;
      UNLOCK();
      return -100;
    }
  }
  else {
    pvVar11 = (void *)(**(code **)(*(long *)pAVar6 + 0x10))();
  }
  *(undefined4 *)((long)pvVar11 + (long)piVar15) = 1;
  if (iVar2 < 1) {
LAB_0015aaeb:
    fVar24 = 0.0;
  }
  else {
    pvVar13 = a->data;
    iVar9 = a->w;
    sVar3 = a->elemsize;
    lVar16 = 0;
    do {
      fVar24 = 0.0;
      if (0 < (int)uVar10) {
        uVar17 = 0;
        do {
          fVar1 = *(float *)((long)pvVar13 + uVar17 * 4);
          fVar24 = fVar24 + fVar1 * fVar1;
          uVar17 = uVar17 + 1;
        } while (uVar19 != uVar17);
      }
      *(float *)((long)pvVar11 + lVar16 * 4) = fVar24;
      lVar16 = lVar16 + 1;
      pvVar13 = (void *)((long)pvVar13 + (long)iVar9 * sVar3);
    } while (lVar16 != lVar12);
    if (iVar2 < 1) goto LAB_0015aaeb;
    fVar24 = 0.0;
    lVar16 = 0;
    do {
      fVar24 = fVar24 + *(float *)((long)pvVar11 + lVar16 * 4);
      lVar16 = lVar16 + 1;
    } while (lVar12 != lVar16);
  }
  *(float *)b->data = fVar24;
  LOCK();
  piVar15 = (int *)((long)pvVar11 + (long)piVar15);
  *piVar15 = *piVar15 + -1;
  UNLOCK();
  if (*piVar15 != 0) {
    return 0;
  }
  if (pAVar6 != (Allocator *)0x0) {
    (**(code **)(*(long *)pAVar6 + 0x18))(pAVar6,pvVar11);
    return 0;
  }
LAB_0015ae3d:
  free(pvVar11);
  return 0;
}

Assistant:

static int reduction_op(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i=0; i<w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;
        
        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> X X
            b.create(1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i=0; i<h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> X h
            b.create(h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }
            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w X
            b.create(w, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);
                for (int j=0; j<w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }
            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> X X X
            b.create(1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i=0; i<channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> X X c
            b.create(channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                b[q] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> X h c
            b.create(h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.row(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> X h X
            b.create(h, elemsize, opt.blob_allocator);
            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }
            
            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i=0; i<h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w X X
            b.create(w, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j=0; j<w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h X
            b.create(w, h, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i=0; i<size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w X c
            b.create(w, channels, elemsize, opt.blob_allocator);
            
            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.row(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }
            return 0;
        }
    }

    return 0;
}